

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::TypeManager::TypeManager
          (TypeManager *this,MessageConsumer *consumer,IRContext *c)

{
  Module *module;
  IRContext *c_local;
  MessageConsumer *consumer_local;
  TypeManager *this_local;
  
  this->consumer_ = consumer;
  this->context_ = c;
  std::
  unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
  ::unordered_map(&this->id_to_type_);
  std::
  unordered_map<const_spvtools::opt::analysis::Type_*,_unsigned_int,_spvtools::opt::analysis::HashTypePointer,_spvtools::opt::analysis::CompareTypePointers,_std::allocator<std::pair<const_spvtools::opt::analysis::Type_*const,_unsigned_int>_>_>
  ::unordered_map(&this->type_to_id_);
  std::
  unordered_set<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>,_spvtools::opt::analysis::HashTypeUniquePointer,_spvtools::opt::analysis::CompareTypeUniquePointers,_std::allocator<std::unique_ptr<spvtools::opt::analysis::Type,_std::default_delete<spvtools::opt::analysis::Type>_>_>_>
  ::unordered_set(&this->type_pool_);
  std::
  vector<spvtools::opt::analysis::TypeManager::UnresolvedType,_std::allocator<spvtools::opt::analysis::TypeManager::UnresolvedType>_>
  ::vector(&this->incomplete_types_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
  ::unordered_map(&this->id_to_incomplete_type_);
  std::
  unordered_map<unsigned_int,_const_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::opt::Instruction_*>_>_>
  ::unordered_map(&this->id_to_constant_inst_);
  module = IRContext::module(c);
  AnalyzeTypes(this,module);
  return;
}

Assistant:

TypeManager::TypeManager(const MessageConsumer& consumer, IRContext* c)
    : consumer_(consumer), context_(c) {
  AnalyzeTypes(*c->module());
}